

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305_vec.cc
# Opt level: O2

void CRYPTO_poly1305_init(poly1305_state *state,uint8_t *key)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(*state + 0x3f) & 0xffffffffffffffc0;
  uVar2 = *(ulong *)key & 0xffc0fffffff;
  uVar4 = (*(ulong *)key >> 0x2c | *(ulong *)(key + 8) << 0x14) & 0xfffffc0ffff;
  uVar1 = *(ulong *)(key + 8) >> 0x18 & 0xffffffc0f;
  *(int *)(uVar3 + 0x94) = (int)uVar2;
  *(int *)(uVar3 + 0x9c) = (int)(uVar2 >> 0x20);
  *(int *)(uVar3 + 0xa4) = (int)uVar4;
  *(int *)(uVar3 + 0xac) = (int)(uVar4 >> 0x20);
  *(int *)(uVar3 + 0xb4) = (int)uVar1;
  *(int *)(uVar3 + 0xbc) = (int)(uVar1 >> 0x20);
  *(undefined4 *)(uVar3 + 0xc4) = *(undefined4 *)(key + 0x10);
  *(undefined4 *)(uVar3 + 0xcc) = *(undefined4 *)(key + 0x14);
  *(undefined4 *)(uVar3 + 0xd4) = *(undefined4 *)(key + 0x18);
  *(undefined4 *)(uVar3 + 0xdc) = *(undefined4 *)(key + 0x1c);
  *(undefined8 *)(uVar3 + 0x120) = 0;
  *(undefined8 *)(uVar3 + 0x128) = 0;
  *(undefined8 *)(uVar3 + 0x130) = 0;
  *(undefined8 *)(uVar3 + 0x138) = 0;
  *(undefined8 *)(uVar3 + 0x140) = 0;
  *(undefined8 *)(uVar3 + 0x148) = 0;
  *(undefined8 *)(uVar3 + 0x150) = 0;
  *(undefined8 *)(uVar3 + 0x158) = 0;
  *(undefined8 *)(uVar3 + 0x160) = 0;
  *(undefined8 *)(uVar3 + 0x168) = 0;
  *(undefined8 *)(uVar3 + 0x170) = 0;
  *(undefined8 *)(uVar3 + 0x178) = 0;
  return;
}

Assistant:

void CRYPTO_poly1305_init(poly1305_state *state, const uint8_t key[32]) {
  poly1305_state_internal *st = poly1305_aligned_state(state);
  poly1305_power *p;
  uint64_t r0, r1, r2;
  uint64_t t0, t1;

  // clamp key
  t0 = CRYPTO_load_u64_le(key + 0);
  t1 = CRYPTO_load_u64_le(key + 8);
  r0 = t0 & 0xffc0fffffff;
  t0 >>= 44;
  t0 |= t1 << 20;
  r1 = t0 & 0xfffffc0ffff;
  t1 >>= 24;
  r2 = t1 & 0x00ffffffc0f;

  // store r in un-used space of st->P[1]
  p = &st->P[1];
  p->R20.d[1] = (uint32_t)(r0);
  p->R20.d[3] = (uint32_t)(r0 >> 32);
  p->R21.d[1] = (uint32_t)(r1);
  p->R21.d[3] = (uint32_t)(r1 >> 32);
  p->R22.d[1] = (uint32_t)(r2);
  p->R22.d[3] = (uint32_t)(r2 >> 32);

  // store pad
  p->R23.d[1] = CRYPTO_load_u32_le(key + 16);
  p->R23.d[3] = CRYPTO_load_u32_le(key + 20);
  p->R24.d[1] = CRYPTO_load_u32_le(key + 24);
  p->R24.d[3] = CRYPTO_load_u32_le(key + 28);

  // H = 0
  st->H[0] = _mm_setzero_si128();
  st->H[1] = _mm_setzero_si128();
  st->H[2] = _mm_setzero_si128();
  st->H[3] = _mm_setzero_si128();
  st->H[4] = _mm_setzero_si128();

  st->started = 0;
  st->leftover = 0;
}